

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_parse_settings.cpp
# Opt level: O1

bool __thiscall ON_ParseSettings::IsInteriorWhiteSpace(ON_ParseSettings *this,ON__UINT32 c)

{
  if ((int)c < 0x2008) {
    if (c != 9) {
      if (c == 0x20) {
        if ((this->m_true_default_bits[0] & 0x8000000) == 0) {
          return true;
        }
      }
      else if (c != 0xa0) {
        return false;
      }
      return (this->m_true_default_bits[0] & 0x10000000) == 0;
    }
    if ((this->m_true_default_bits[0] & 0x4000000) == 0) {
      return true;
    }
  }
  else {
    if (c - 0x2008 < 3) {
      return (this->m_true_default_bits[0] & 0x20000000) == 0;
    }
    if (c == 0x202f) {
      return (this->m_true_default_bits[0] & 0x40000000) == 0;
    }
  }
  return false;
}

Assistant:

bool ON_ParseSettings::IsInteriorWhiteSpace(ON__UINT32 c) const
{
  switch(c)
  {
  case 0x0009: // horizontal tab
    if ( ParseHorizontalTabAsWhiteSpace() )
      return true;
    break;

  case 0x0020: // space
    if ( ParseSpaceAsWhiteSpace() )
      return true;

  case 0x00A0: // no-break space
    return ParseNoBreakSpaceAsWhiteSpace();
    break;

  case 0x2008: // thin space
  case 0x2009: // thin space
  case 0x200A: // hair thin space
    return ParseThinSpaceAsWhiteSpace();
    break;

  case 0x202F: // narrow no-break
    return ParseNoBreakThinSpaceAsWhiteSpace();
    break;
  }

  return false;
}